

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Performance::anon_unknown_1::
RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::~RenderCase
          (RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
           *this)

{
  code *pcVar1;
  RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration> *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

RenderCase<SampleType>::~RenderCase (void)
{
	deinit();
}